

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

bool __thiscall
doctest::detail::ResultBuilder::binary_assert<0,int,int>(ResultBuilder *this,int *lhs,int *rhs)

{
  int iVar1;
  int iVar2;
  ContextOptions *pCVar3;
  int *in_R8;
  String SStack_38;
  
  iVar2 = *lhs;
  iVar1 = *rhs;
  (this->super_AssertData).m_failed = iVar2 != iVar1;
  if (iVar2 == iVar1) {
    pCVar3 = getContextOptions();
    if (pCVar3->success != true) goto LAB_00198919;
  }
  stringifyBinaryExpr<int,int>(&SStack_38,(detail *)lhs,(int *)0x1b3e9a,(char *)rhs,in_R8);
  String::operator=(&(this->super_AssertData).m_decomp,&SStack_38);
  String::~String(&SStack_38);
LAB_00198919:
  return (bool)((this->super_AssertData).m_failed ^ 1);
}

Assistant:

DOCTEST_NOINLINE bool binary_assert(const DOCTEST_REF_WRAP(L) lhs,
                                                const DOCTEST_REF_WRAP(R) rhs) {
                m_failed = !RelationalComparator<comparison, L, R>()(lhs, rhs);
                if(m_failed || getContextOptions()->success)
                    m_decomp = stringifyBinaryExpr(lhs, ", ", rhs);
                return !m_failed;
            }